

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

int __thiscall
testing::internal::UnitTestImpl::FilterTests(UnitTestImpl *this,ReactionToSharding shard_tests)

{
  value_type pTVar1;
  bool bVar2;
  reference ppTVar3;
  char *pcVar4;
  reference ppTVar5;
  string *name;
  int in_ESI;
  long in_RDI;
  bool is_selected;
  bool is_in_another_shard;
  bool is_runnable;
  bool matches_filter;
  bool is_disabled;
  string test_name;
  TestInfo *test_info;
  size_t j;
  string *test_suite_name;
  TestSuite *test_suite;
  iterator __end2;
  iterator __begin2;
  vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *__range2;
  int num_selected_tests;
  int num_runnable_tests;
  UnitTestFilter disable_test_filter;
  PositiveAndNegativeUnitTestFilter gtest_flag_filter;
  int32_t shard_index;
  int32_t total_shards;
  undefined4 in_stack_fffffffffffffdc8;
  int iVar6;
  undefined3 uVar7;
  undefined4 in_stack_fffffffffffffdcc;
  TestSuite *in_stack_fffffffffffffdd0;
  byte local_227;
  byte local_226;
  bool local_225;
  bool local_222;
  UnitTestFilter *in_stack_fffffffffffffdf0;
  char *in_stack_fffffffffffffdf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe00;
  undefined8 in_stack_fffffffffffffe10;
  int32_t default_val;
  char *in_stack_fffffffffffffe18;
  int local_1e0;
  int local_1dc;
  undefined2 in_stack_fffffffffffffe30;
  byte in_stack_fffffffffffffe32;
  byte in_stack_fffffffffffffe33;
  byte in_stack_fffffffffffffe34;
  undefined1 in_stack_fffffffffffffe35;
  allocator<char> in_stack_fffffffffffffe37;
  string *in_stack_fffffffffffffe38;
  PositiveAndNegativeUnitTestFilter *in_stack_fffffffffffffe40;
  char *local_1a0;
  allocator<char> local_191;
  string local_190 [32];
  string *local_170;
  TestSuite *local_168;
  TestSuite **local_160;
  __normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
  local_158;
  long local_150;
  int local_144;
  int local_140;
  allocator<char> local_129;
  string local_128 [48];
  string *in_stack_ffffffffffffff08;
  UnitTestFilter *in_stack_ffffffffffffff10;
  string *in_stack_ffffffffffffffa8;
  PositiveAndNegativeUnitTestFilter *in_stack_ffffffffffffffb0;
  
  default_val = (int32_t)((ulong)in_stack_fffffffffffffe10 >> 0x20);
  if (in_ESI == 0) {
    local_1dc = Int32FromEnvOrDie(in_stack_fffffffffffffe18,default_val);
    local_1e0 = Int32FromEnvOrDie(in_stack_fffffffffffffe18,default_val);
    local_225 = (bool)in_stack_fffffffffffffe34;
  }
  else {
    local_1dc = -1;
    local_1e0 = -1;
    local_225 = (bool)in_stack_fffffffffffffe34;
  }
  anon_unknown_37::PositiveAndNegativeUnitTestFilter::PositiveAndNegativeUnitTestFilter
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
             (allocator<char> *)in_stack_fffffffffffffdf0);
  anon_unknown_37::UnitTestFilter::UnitTestFilter
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  std::__cxx11::string::~string(local_128);
  std::allocator<char>::~allocator(&local_129);
  local_140 = 0;
  local_144 = 0;
  local_150 = in_RDI + 0xb8;
  local_158._M_current =
       (TestSuite **)
       std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>::begin
                 ((vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *)
                  CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
  local_160 = (TestSuite **)
              std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>::end
                        ((vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *)
                         CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
  while (bVar2 = __gnu_cxx::operator!=
                           ((__normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
                             *)in_stack_fffffffffffffdd0,
                            (__normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
                             *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8)), bVar2
        ) {
    ppTVar3 = __gnu_cxx::
              __normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
              ::operator*(&local_158);
    local_168 = *ppTVar3;
    TestSuite::name((TestSuite *)0x14a6c9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
               (allocator<char> *)in_stack_fffffffffffffdf0);
    std::allocator<char>::~allocator(&local_191);
    local_170 = local_190;
    TestSuite::set_should_run(local_168,false);
    local_1a0 = (char *)0x0;
    while( true ) {
      in_stack_fffffffffffffdf8 = local_1a0;
      in_stack_fffffffffffffe00 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           TestSuite::test_info_list(local_168);
      pcVar4 = (char *)std::vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>::size
                                 ((vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                                   *)in_stack_fffffffffffffe00);
      if (pcVar4 <= in_stack_fffffffffffffdf8) break;
      in_stack_fffffffffffffdf0 = (UnitTestFilter *)TestSuite::test_info_list(local_168);
      ppTVar5 = std::vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>::operator[]
                          ((vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_> *)
                           in_stack_fffffffffffffdf0,(size_type)local_1a0);
      pTVar1 = *ppTVar5;
      name = (string *)TestInfo::name((TestInfo *)0x14a7af);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
                 (allocator<char> *)in_stack_fffffffffffffdf0);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe37);
      bVar2 = anon_unknown_37::UnitTestFilter::MatchesName(in_stack_fffffffffffffdf0,name);
      local_222 = true;
      if (!bVar2) {
        local_222 = anon_unknown_37::UnitTestFilter::MatchesName(in_stack_fffffffffffffdf0,name);
      }
      pTVar1->is_disabled_ = local_222;
      in_stack_fffffffffffffe35 =
           anon_unknown_37::PositiveAndNegativeUnitTestFilter::MatchesTest
                     (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
                      (string *)
                      CONCAT17(in_stack_fffffffffffffe37,
                               CONCAT16(local_222,
                                        CONCAT15(in_stack_fffffffffffffe35,
                                                 CONCAT14(local_225,
                                                          CONCAT13(in_stack_fffffffffffffe33,
                                                                   CONCAT12(
                                                  in_stack_fffffffffffffe32,
                                                  in_stack_fffffffffffffe30)))))));
      pTVar1->matches_filter_ = (bool)in_stack_fffffffffffffe35;
      if (((FLAGS_gtest_also_run_disabled_tests & 1) != 0) ||
         (local_225 = false, (local_222 & 1U) == 0)) {
        local_225 = (bool)in_stack_fffffffffffffe35;
      }
      local_226 = 0;
      if (in_ESI != 1) {
        bVar2 = ShouldRunTestOnShard(local_1dc,local_1e0,local_140);
        local_226 = bVar2 ^ 0xff;
      }
      in_stack_fffffffffffffe33 = local_226 & 1;
      pTVar1->is_in_another_shard_ = (bool)in_stack_fffffffffffffe33;
      local_227 = 0;
      if ((local_225 & 1U) != 0) {
        local_227 = in_stack_fffffffffffffe33 ^ 0xff;
      }
      in_stack_fffffffffffffe32 = local_227 & 1;
      local_140 = local_140 + (local_225 & 1);
      local_144 = local_144 + (uint)in_stack_fffffffffffffe32;
      pTVar1->should_run_ = (bool)in_stack_fffffffffffffe32;
      in_stack_fffffffffffffdd0 = local_168;
      bVar2 = TestSuite::should_run(local_168);
      uVar7 = (undefined3)in_stack_fffffffffffffdcc;
      in_stack_fffffffffffffdcc = CONCAT13(1,uVar7);
      if (!bVar2) {
        in_stack_fffffffffffffdcc = CONCAT13(in_stack_fffffffffffffe32,uVar7);
      }
      TestSuite::set_should_run
                (in_stack_fffffffffffffdd0,
                 (bool)((byte)((uint)in_stack_fffffffffffffdcc >> 0x18) & 1));
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffe38);
      local_1a0 = local_1a0 + 1;
    }
    std::__cxx11::string::~string(local_190);
    __gnu_cxx::
    __normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
    ::operator++(&local_158);
  }
  iVar6 = local_144;
  anon_unknown_37::UnitTestFilter::~UnitTestFilter((UnitTestFilter *)in_stack_fffffffffffffdd0);
  anon_unknown_37::PositiveAndNegativeUnitTestFilter::~PositiveAndNegativeUnitTestFilter
            ((PositiveAndNegativeUnitTestFilter *)in_stack_fffffffffffffdd0);
  return iVar6;
}

Assistant:

int UnitTestImpl::FilterTests(ReactionToSharding shard_tests) {
  const int32_t total_shards = shard_tests == HONOR_SHARDING_PROTOCOL
                                   ? Int32FromEnvOrDie(kTestTotalShards, -1)
                                   : -1;
  const int32_t shard_index = shard_tests == HONOR_SHARDING_PROTOCOL
                                  ? Int32FromEnvOrDie(kTestShardIndex, -1)
                                  : -1;

  const PositiveAndNegativeUnitTestFilter gtest_flag_filter(
      GTEST_FLAG_GET(filter));
  const UnitTestFilter disable_test_filter(kDisableTestFilter);
  // num_runnable_tests are the number of tests that will
  // run across all shards (i.e., match filter and are not disabled).
  // num_selected_tests are the number of tests to be run on
  // this shard.
  int num_runnable_tests = 0;
  int num_selected_tests = 0;
  for (auto* test_suite : test_suites_) {
    const std::string& test_suite_name = test_suite->name();
    test_suite->set_should_run(false);

    for (size_t j = 0; j < test_suite->test_info_list().size(); j++) {
      TestInfo* const test_info = test_suite->test_info_list()[j];
      const std::string test_name(test_info->name());
      // A test is disabled if test suite name or test name matches
      // kDisableTestFilter.
      const bool is_disabled =
          disable_test_filter.MatchesName(test_suite_name) ||
          disable_test_filter.MatchesName(test_name);
      test_info->is_disabled_ = is_disabled;

      const bool matches_filter =
          gtest_flag_filter.MatchesTest(test_suite_name, test_name);
      test_info->matches_filter_ = matches_filter;

      const bool is_runnable =
          (GTEST_FLAG_GET(also_run_disabled_tests) || !is_disabled) &&
          matches_filter;

      const bool is_in_another_shard =
          shard_tests != IGNORE_SHARDING_PROTOCOL &&
          !ShouldRunTestOnShard(total_shards, shard_index, num_runnable_tests);
      test_info->is_in_another_shard_ = is_in_another_shard;
      const bool is_selected = is_runnable && !is_in_another_shard;

      num_runnable_tests += is_runnable;
      num_selected_tests += is_selected;

      test_info->should_run_ = is_selected;
      test_suite->set_should_run(test_suite->should_run() || is_selected);
    }
  }
  return num_selected_tests;
}